

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexBaseExc.cpp
# Opt level: O1

void __thiscall Iex_3_4::BaseExc::BaseExc(BaseExc *this,string *s)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__EnotenqueuedExc_00174618;
  (this->_message)._M_dataplus._M_p = (pointer)&(this->_message).field_2;
  pcVar1 = (s->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_message,pcVar1,pcVar1 + s->_M_string_length);
  if ((anonymous_namespace)::currentStackTracer_abi_cxx11_ == (code *)0x0) {
    (this->_stackTrace)._M_dataplus._M_p = (pointer)&(this->_stackTrace).field_2;
    (this->_stackTrace)._M_string_length = 0;
    (this->_stackTrace).field_2._M_local_buf[0] = '\0';
  }
  else {
    (*(anonymous_namespace)::currentStackTracer_abi_cxx11_)(&this->_stackTrace);
  }
  return;
}

Assistant:

BaseExc::BaseExc (const std::string& s)
    : _message (s)
    , _stackTrace (currentStackTracer ? currentStackTracer () : std::string ())
{
    // empty
}